

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsc_mbox.hpp
# Opt level: O2

void __thiscall
so_5::impl::limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
unsubscribe_event_handlers
          (limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>
           *this,type_index *param_1,agent_t *subscriber)

{
  default_rw_spinlock_t *this_00;
  allocator local_39;
  string local_38 [32];
  
  this_00 = &this->m_lock;
  rw_spinlock_t<so_5::yield_backoff_t>::lock(this_00);
  if (this->m_single_consumer != subscriber) {
    std::__cxx11::string::string
              (local_38,"the only one consumer can remove subscription to mpsc_mbox",&local_39);
    exception_t::raise(0x282ddc);
    std::__cxx11::string::~string(local_38);
  }
  if (this->m_subscriptions_count != 0) {
    this->m_subscriptions_count = this->m_subscriptions_count - 1;
  }
  LOCK();
  (this_00->m_counters).super___atomic_base<unsigned_long>._M_i =
       (this_00->m_counters).super___atomic_base<unsigned_long>._M_i - 1;
  UNLOCK();
  return;
}

Assistant:

virtual void
		unsubscribe_event_handlers(
			const std::type_index & /*msg_type*/,
			agent_t * subscriber ) override
			{
				std::lock_guard< default_rw_spinlock_t > lock{ m_lock };

				if( subscriber != m_single_consumer )
					SO_5_THROW_EXCEPTION(
							rc_illegal_subscriber_for_mpsc_mbox,
							"the only one consumer can remove subscription to mpsc_mbox" );
				if( m_subscriptions_count )
					--m_subscriptions_count;
			}